

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SslSocket.cpp
# Opt level: O0

void OutputDebugString(wchar_t *pOut)

{
  undefined4 __fd;
  void *__buf;
  size_t __n;
  wstring_convert<std::codecvt_utf8<wchar_t,_1114111UL,_(std::codecvt_mode)0>,_wchar_t,_std::allocator<wchar_t>,_std::allocator<char>_>
  local_d0;
  byte_string local_70;
  allocator<wchar_t> local_39;
  undefined1 local_38 [8];
  wstring strTmp;
  int fdPipe;
  wchar_t *pOut_local;
  
  strTmp.field_2._M_local_buf[3] = open("/tmp/dbgout",0x801);
  if (L'\xffffffff' < strTmp.field_2._M_local_buf[3]) {
    std::allocator<wchar_t>::allocator();
    std::__cxx11::wstring::wstring<std::allocator<wchar_t>>((wstring *)local_38,pOut,&local_39);
    std::allocator<wchar_t>::~allocator(&local_39);
    __fd = strTmp.field_2._M_local_buf[3];
    std::__cxx11::
    wstring_convert<std::codecvt_utf8<wchar_t,_1114111UL,_(std::codecvt_mode)0>,_wchar_t,_std::allocator<wchar_t>,_std::allocator<char>_>
    ::wstring_convert(&local_d0);
    std::__cxx11::
    wstring_convert<std::codecvt_utf8<wchar_t,_1114111UL,_(std::codecvt_mode)0>,_wchar_t,_std::allocator<wchar_t>,_std::allocator<char>_>
    ::to_bytes(&local_70,&local_d0,(wide_string *)local_38);
    __buf = (void *)std::__cxx11::string::c_str();
    __n = std::__cxx11::wstring::size();
    write(__fd,__buf,__n);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::
    wstring_convert<std::codecvt_utf8<wchar_t,_1114111UL,_(std::codecvt_mode)0>,_wchar_t,_std::allocator<wchar_t>,_std::allocator<char>_>
    ::~wstring_convert(&local_d0);
    close(strTmp.field_2._M_local_buf[3]);
    std::__cxx11::wstring::~wstring((wstring *)local_38);
  }
  return;
}

Assistant:

void OutputDebugString(const wchar_t* pOut)
{   // mkfifo /tmp/dbgout  ->  tail -f /tmp/dbgout
    int fdPipe = open("/tmp/dbgout", O_WRONLY | O_NONBLOCK);
    if (fdPipe >= 0)
    {
        wstring strTmp(pOut);
        write(fdPipe, wstring_convert<std::codecvt_utf8<wchar_t>, wchar_t>().to_bytes(strTmp).c_str(), strTmp.size());
        close(fdPipe);
    }
}